

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

void __thiscall QFSFileEngine::~QFSFileEngine(QFSFileEngine *this)

{
  QFSFileEnginePrivate *this_00;
  
  (this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine =
       (_func_int **)&PTR__QFSFileEngine_0017d510;
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  if (this_00->closeFileHandle == true) {
    if ((FILE *)this_00->fh == (FILE *)0x0) {
      if (this_00->fd != -1) {
        qt_safe_close(this_00->fd);
      }
    }
    else {
      fclose((FILE *)this_00->fh);
    }
  }
  QFSFileEnginePrivate::unmapAll(this_00);
  QAbstractFileEngine::~QAbstractFileEngine(&this->super_QAbstractFileEngine);
  return;
}

Assistant:

QFSFileEngine::~QFSFileEngine()
{
    Q_D(QFSFileEngine);
    if (d->closeFileHandle) {
        if (d->fh) {
            fclose(d->fh);
        } else if (d->fd != -1) {
            QT_CLOSE(d->fd);
        }
    }
    d->unmapAll();
}